

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::rejectEnter
          (SPxSolverBase<double> *this,SPxId enterId,double enterTest,Status enterStat)

{
  bool bVar1;
  double *pdVar2;
  Status *pSVar3;
  Status in_EDX;
  SPxSolverBase<double> *in_RDI;
  double in_XMM0_Qa;
  int enterIdx;
  undefined8 in_stack_ffffffffffffffb8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SPxId *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SPxId local_8;
  
  SPxLPBase<double>::number
            ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  bVar1 = isId(in_RDI,&local_8);
  if (bVar1) {
    iVar4 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar4);
    *pdVar2 = in_XMM0_Qa;
    SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
    pSVar3 = SPxBasisBase<double>::Desc::status
                       ((Desc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar4)
    ;
    *pSVar3 = in_EDX;
  }
  else {
    iVar4 = (int)((ulong)in_XMM0_Qa >> 0x20);
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar4);
    *pdVar2 = in_XMM0_Qa;
    SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
    pSVar3 = SPxBasisBase<double>::Desc::coStatus
                       ((Desc *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),iVar4);
    *pSVar3 = in_EDX;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::rejectEnter(
   SPxId enterId,
   R enterTest,
   typename SPxBasisBase<R>::Desc::Status enterStat
)
{
   int enterIdx = this->number(enterId);

   if(isId(enterId))
   {
      theTest[enterIdx] = enterTest;
      this->desc().status(enterIdx) = enterStat;
   }
   else
   {
      theCoTest[enterIdx] = enterTest;
      this->desc().coStatus(enterIdx) = enterStat;
   }
}